

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDeriveWithOnePo(Abc_Ntk_t *pNtk,Vec_Int_t *vNodeIds,Vec_Int_t *vNodeValues)

{
  long *plVar1;
  uint uVar2;
  Vec_Ptr_t *vFanins;
  void **ppvVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  long lVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vFanins->pArray = ppvVar3;
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar4;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      if (pVVar8->pArray[lVar5] != (void *)0x0) {
        *(undefined8 *)((long)pVVar8->pArray[lVar5] + 0x40) = 0;
      }
      lVar5 = lVar5 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar5 < pVVar8->nSize);
  }
  if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
    pAVar6 = Abc_AigConst1(pNtk_00);
    pAVar7 = Abc_AigConst1(pNtk);
    (pAVar7->field_6).pCopy = pAVar6;
  }
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar8->pArray[lVar5],1);
      lVar5 = lVar5 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar5 < pVVar8->nSize);
  }
  pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar6,"monitor",(char *)0x0);
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      Abc_NtkDupBox(pNtk_00,(Abc_Obj_t *)pVVar8->pArray[lVar5],1);
      lVar5 = lVar5 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar5 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar8->pArray[lVar5];
      if (((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).pTemp == (void *)0x0)) &&
         ((*(uint *)&pAVar6->field_0x14 & 0xf) != 3)) {
        Abc_NtkDupObj(pNtk_00,pAVar6,0);
      }
      lVar5 = lVar5 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar5 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      plVar1 = (long *)pVVar8->pArray[lVar5];
      if (((plVar1 != (long *)0x0) &&
          (uVar2 = *(uint *)((long)plVar1 + 0x14) & 0xf,
          (*(uint *)((long)plVar1 + 0x14) & 0xe) != 8 && uVar2 != 3)) &&
         ((uVar2 != 5 && ((uVar2 != 10 && (0 < *(int *)((long)plVar1 + 0x1c))))))) {
        lVar10 = 0;
        do {
          Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],
                          *(Abc_Obj_t **)
                           (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                     (long)*(int *)(plVar1[4] + lVar10 * 4) * 8) + 0x40));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)plVar1 + 0x1c));
      }
      lVar5 = lVar5 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar5 < pVVar8->nSize);
  }
  if (vNodeIds->nSize < 1) {
    pAVar6 = (Abc_Obj_t *)0x0;
  }
  else {
    lVar5 = 0;
    pAVar6 = (Abc_Obj_t *)0x0;
    do {
      if (vNodeValues->nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vNodeIds->pArray[lVar5];
      if (((int)uVar2 < 0) || (pNtk->vObjs->nSize <= (int)uVar2)) goto LAB_00828f77;
      pAVar7 = *(Abc_Obj_t **)((long)pNtk->vObjs->pArray[uVar2] + 0x40);
      if (vNodeValues->pArray[lVar5] == 0) {
        pAVar7 = Abc_NtkCreateNodeInv(pNtk_00,pAVar7);
      }
      if (pAVar6 != (Abc_Obj_t *)0x0) {
        if (vFanins->nCap < 2) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x10);
          }
          else {
            ppvVar3 = (void **)realloc(vFanins->pArray,0x10);
          }
          vFanins->pArray = ppvVar3;
          vFanins->nCap = 2;
        }
        lVar10 = 0;
        do {
          pAVar9 = pAVar7;
          if (lVar10 == 0) {
            pAVar9 = pAVar6;
          }
          vFanins->pArray[lVar10] = pAVar9;
          lVar10 = lVar10 + 1;
        } while (lVar10 == 1);
        vFanins->nSize = 2;
        pAVar7 = Abc_NtkCreateNodeAnd(pNtk_00,vFanins);
      }
      pAVar6 = pAVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vNodeIds->nSize);
  }
  if (vFanins->pArray != (void **)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (void **)0x0;
  }
  free(vFanins);
  if (0 < pNtk_00->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pNtk_00->vPos->pArray,pAVar6);
    if (pNtk_00->vPos->nSize != 1) {
      __assert_fail("Abc_NtkPoNum(pNtkNew) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xbbe,
                    "Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (pNtk_00->vCis->nSize != pNtk->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtkNew) == Abc_NtkCiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xbbf,
                    "Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (pNtk_00->nObjCounts[8] != pNtk->nObjCounts[8]) {
      __assert_fail("Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xbc0,
                    "Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    return pNtk_00;
  }
LAB_00828f77:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveWithOnePo( Abc_Ntk_t * pNtk, Vec_Int_t * vNodeIds, Vec_Int_t * vNodeValues )
{
    int fCopyNames = 1;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pObjNew, * pOutputNew;
    Vec_Ptr_t * vFanins = Vec_PtrAlloc( 100 );
    int i, k, Id, Value;
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    //Abc_NtkForEachPo( pNtk, pObj, i )
    //    Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    // create one PO
    pObjNew = Abc_NtkCreateObj( pNtkNew, ABC_OBJ_PO );
    Abc_ObjAssignName( pObjNew, "monitor", NULL );
    // create boxes
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );

    // duplicate nodes (CIs/COs/latches are already duplicated)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && !Abc_ObjIsPo(pObj) )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects except boxes (they are already connected) and POs (they will be connected later)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // AND nodes (with interters if needed)
    pOutputNew = NULL;
    Vec_IntForEachEntryTwo( vNodeIds, vNodeValues, Id, Value, i )
    {
        pObjNew = Abc_NtkObj( pNtk, Id )->pCopy;
        if ( Value == 0 ) // negative polarity - add inverter
            pObjNew = Abc_NtkCreateNodeInv( pNtkNew, pObjNew );
        if ( pOutputNew == NULL )
            pOutputNew = pObjNew;
        else
        {
            Vec_PtrFillTwo( vFanins, 2, pOutputNew, pObjNew );
            pOutputNew = Abc_NtkCreateNodeAnd( pNtkNew, vFanins );
        }
    }
    Vec_PtrFree( vFanins );
    // create the only POs, which is the AND of the corresponding nodes
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, 0), pOutputNew );

    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPoNum(pNtkNew)    == 1 );
    assert( Abc_NtkCiNum(pNtkNew)    == Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk) );
    return pNtkNew;
}